

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O0

void __thiscall
bloaty::RangeMapTest_UnknownSize3_Test::TestBody(RangeMapTest_UnknownSize3_Test *this)

{
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  long in_RDI;
  string *in_stack_fffffffffffffe18;
  RangeMapTest *in_stack_fffffffffffffe20;
  uint64_t in_stack_fffffffffffffe28;
  RangeMap *in_stack_fffffffffffffe30;
  allocator_type *in_stack_fffffffffffffe48;
  undefined8 ***pppuVar1;
  allocator<char> *in_stack_fffffffffffffe50;
  undefined8 ***pppuVar2;
  char *in_stack_fffffffffffffe58;
  iterator pEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 local_134 [3];
  allocator<char> local_131;
  undefined8 **local_130;
  undefined8 **local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined8 **local_b8;
  undefined8 local_b0;
  allocator<char> local_89;
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  RangeMap::AddRange(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     (uint64_t)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  RangeMap::AddRange(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     (uint64_t)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  RangeMap::AddRange(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     (uint64_t)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  local_134[1] = 1;
  local_130 = &local_128;
  local_128 = (undefined8 **)0x64;
  local_120 = 0x96;
  local_118 = *(undefined8 *)(in_RDI + 0xa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  local_130 = (undefined8 **)&local_f0;
  local_f0 = 0x96;
  local_e8 = 200;
  local_e0 = *(undefined8 *)(in_RDI + 0xa0);
  this_00 = &local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  local_134[1] = 0;
  local_b8 = &local_128;
  local_b0 = 2;
  pEVar3 = (iterator)local_134;
  std::allocator<bloaty::RangeMapTest::Entry>::allocator
            ((allocator<bloaty::RangeMapTest::Entry> *)0x17995d);
  __l._M_len = (size_type)this_00;
  __l._M_array = pEVar3;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             in_stack_fffffffffffffe50,__l,in_stack_fffffffffffffe48);
  RangeMapTest::AssertMainMapEquals
            (in_stack_fffffffffffffe20,
             (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             in_stack_fffffffffffffe18);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             in_stack_fffffffffffffe30);
  std::allocator<bloaty::RangeMapTest::Entry>::~allocator
            ((allocator<bloaty::RangeMapTest::Entry> *)0x1799b2);
  pppuVar1 = &local_128;
  pppuVar2 = &local_b8;
  do {
    pppuVar2 = pppuVar2 + -7;
    RangeMapTest::Entry::~Entry((Entry *)0x1799db);
  } while (pppuVar2 != pppuVar1);
  std::allocator<char>::~allocator((allocator<char> *)(local_134 + 2));
  std::allocator<char>::~allocator(&local_131);
  return;
}

Assistant:

TEST_F(RangeMapTest, UnknownSize3) {
  map_.AddRange(100, kUnknownSize, "foo");
  map_.AddRange(150, kUnknownSize, "bar");
  // This tells us the ultimate size of "foo", and we keep the "foo" label even
  // though the new label is "baz".
  map_.AddRange(100, 100, "baz");
  AssertMainMapEquals({
    {100, 150, kNoTranslation, "foo"},
    {150, 200, kNoTranslation, "bar"},
  });
}